

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildtexture.cpp
# Opt level: O0

int __thiscall FTextureManager::CountTiles(FTextureManager *this,void *tiles)

{
  undefined4 local_30;
  int tileend;
  int tilestart;
  int version;
  void *tiles_local;
  FTextureManager *this_local;
  
  if (*tiles == 1) {
    if (*(int *)((long)tiles + 0xc) < *(int *)((long)tiles + 8)) {
      local_30 = 0;
    }
    else {
      local_30 = (*(int *)((long)tiles + 0xc) - *(int *)((long)tiles + 8)) + 1;
    }
    this_local._4_4_ = local_30;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int FTextureManager::CountTiles (void *tiles)
{
	int version = LittleLong(*(DWORD *)tiles);
	if (version != 1)
	{
		return 0;
	}

	int tilestart = LittleLong(((DWORD *)tiles)[2]);
	int tileend = LittleLong(((DWORD *)tiles)[3]);

	return tileend >= tilestart ? tileend - tilestart + 1 : 0;
}